

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseExportDesc(WastParser *this,Export *export_)

{
  Result RVar1;
  TokenType TVar2;
  ExternalKind EVar3;
  Enum EVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  Token local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  allocator_type local_29;
  
  RVar1 = Expect(this,Lpar);
  EVar4 = Error;
  if (RVar1.enum_ == Error) {
    return (Result)Error;
  }
  EVar3 = First;
  TVar2 = Peek(this,0);
  switch(TVar2) {
  case Except:
    EVar3 = Except;
    break;
  case Export:
  case Get:
  case Import:
  case Invoke:
  case Local:
  case Lpar:
switchD_00f5cf8a_caseD_f:
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"an external kind","");
    __l._M_len = 1;
    __l._M_array = &local_68;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_48,__l,&local_29);
    RVar1 = ErrorExpected(this,&local_48,(char *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) {
      return (Result)RVar1.enum_;
    }
    operator_delete(local_68._M_dataplus._M_p);
    return (Result)RVar1.enum_;
  case Func:
    break;
  case Global:
    EVar3 = Global;
    break;
  case Memory:
    EVar3 = Memory;
    break;
  default:
    if (TVar2 != Table) goto switchD_00f5cf8a_caseD_f;
    EVar3 = Table;
  }
  export_->kind = EVar3;
  Consume(&local_b8,this);
  Token::~Token(&local_b8);
  RVar1 = ParseVar(this,&export_->var);
  if (RVar1.enum_ != Error) {
    RVar1 = Expect(this,Rpar);
    EVar4 = (Enum)(RVar1.enum_ == Error);
  }
  return (Result)EVar4;
}

Assistant:

Result WastParser::ParseExportDesc(Export* export_) {
  WABT_TRACE(ParseExportDesc);
  EXPECT(Lpar);
  switch (Peek()) {
    case TokenType::Func:   export_->kind = ExternalKind::Func; break;
    case TokenType::Table:  export_->kind = ExternalKind::Table; break;
    case TokenType::Memory: export_->kind = ExternalKind::Memory; break;
    case TokenType::Global: export_->kind = ExternalKind::Global; break;
    case TokenType::Except: export_->kind = ExternalKind::Except; break;
    default:
      return ErrorExpected({"an external kind"});
  }
  Consume();
  CHECK_RESULT(ParseVar(&export_->var));
  EXPECT(Rpar);
  return Result::Ok;
}